

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::update<QRegion>(QWidgetPrivate *this,QRegion *r)

{
  bool bVar1;
  QWidget *paintRegion;
  ulong uVar2;
  QUpdateLaterEvent *this_00;
  QTLWExtra *pQVar3;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QTLWExtra *tlwExtra;
  QWidget *q;
  QRegion clipped;
  QWidgetPrivate *in_stack_ffffffffffffffa0;
  QWidget *in_stack_ffffffffffffffb8;
  QWidget *pQVar5;
  QWidgetPrivate *widget;
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RSI;
  widget = in_RDI;
  paintRegion = q_func(in_RDI);
  if (((*(uint *)&in_RDI->field_0x250 >> 0x18 & 1) == 0) ||
     (bVar1 = QWidget::isVisible((QWidget *)0x38befc), bVar1)) {
    bVar1 = QWidget::isVisible((QWidget *)0x38bf2c);
    if ((bVar1) && (bVar1 = QWidget::updatesEnabled((QWidget *)0x38bf3c), bVar1)) {
      local_10.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QVar4 = QWidget::rect(in_stack_ffffffffffffffb8);
      QRegion::operator&(&local_10,(QRect *)in_RSI);
      uVar2 = QRegion::isEmpty();
      if ((uVar2 & 1) == 0) {
        bVar1 = QWidget::testAttribute
                          (in_RSI,(WidgetAttribute)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
        if (bVar1) {
          this_00 = (QUpdateLaterEvent *)operator_new(0x18);
          QUpdateLaterEvent::QUpdateLaterEvent(this_00,(QRegion *)paintRegion);
          QCoreApplication::postEvent(&paintRegion->super_QObject,&this_00->super_QEvent,0);
        }
        else {
          QWidget::window((QWidget *)in_RDI);
          QWidget::d_func((QWidget *)0x38bffc);
          pQVar3 = maybeTopData(in_stack_ffffffffffffffa0);
          if (((pQVar3 != (QTLWExtra *)0x0) && (pQVar3->backingStore != (QBackingStore *)0x0)) &&
             (bVar1 = std::unique_ptr::operator_cast_to_bool
                                ((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                                  *)0x38c02b), bVar1)) {
            std::unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::
            operator->((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                        *)0x38c03f);
            QWidgetRepaintManager::markDirty<QRegion>
                      (QVar4._8_8_,QVar4._0_8_,(QWidget *)widget,(UpdateTime)((ulong)pQVar5 >> 0x20)
                       ,(BufferState)pQVar5);
          }
        }
      }
      QRegion::~QRegion(&local_10);
    }
  }
  else {
    *(uint *)&in_RDI->field_0x250 = *(uint *)&in_RDI->field_0x250 & 0xf7ffffff | 0x8000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::update(T r)
{
    Q_Q(QWidget);

    if (renderToTexture && !q->isVisible()) {
        renderToTextureReallyDirty = 1;
        return;
    }

    if (!q->isVisible() || !q->updatesEnabled())
        return;

    T clipped = r & q->rect();

    if (clipped.isEmpty())
        return;

    if (q->testAttribute(Qt::WA_WState_InPaintEvent)) {
        QCoreApplication::postEvent(q, new QUpdateLaterEvent(clipped));
        return;
    }

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore && tlwExtra->repaintManager)
        tlwExtra->repaintManager->markDirty(clipped, q);
}